

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# physical_top_n.cpp
# Opt level: O2

void __thiscall
duckdb::TopNHeap::TopNHeap
          (TopNHeap *this,ClientContext *context,Allocator *allocator,
          vector<duckdb::LogicalType,_true> *payload_types_p,
          vector<duckdb::BoundOrderByNode,_true> *orders_p,idx_t limit,idx_t offset)

{
  pointer pBVar1;
  ulong uVar2;
  DataChunk *this_00;
  DataChunk *this_01;
  Allocator *allocator_00;
  BufferManager *pBVar3;
  pointer pEVar4;
  type expr;
  pointer __args;
  ulong uVar5;
  initializer_list<duckdb::LogicalType> __l;
  allocator_type local_c9;
  DataChunk *local_c8;
  DataChunk *local_c0;
  DataChunk *local_b8;
  DataChunk *local_b0;
  DataChunk *local_a8;
  DataChunk *local_a0;
  unsafe_vector<TopNEntry> *local_98;
  Allocator *local_90;
  vector<duckdb::LogicalType,_true> sort_types;
  LogicalType local_60;
  vector<duckdb::LogicalType,_true> sort_keys_type;
  
  this->allocator = allocator;
  local_90 = allocator;
  pBVar3 = BufferManager::GetBufferManager(context);
  this->buffer_manager = pBVar3;
  local_98 = &this->heap;
  (this->heap).super_vector<duckdb::TopNEntry,_std::allocator<duckdb::TopNEntry>_>.
  super__Vector_base<duckdb::TopNEntry,_std::allocator<duckdb::TopNEntry>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->heap).super_vector<duckdb::TopNEntry,_std::allocator<duckdb::TopNEntry>_>.
  super__Vector_base<duckdb::TopNEntry,_std::allocator<duckdb::TopNEntry>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->heap).super_vector<duckdb::TopNEntry,_std::allocator<duckdb::TopNEntry>_>.
  super__Vector_base<duckdb::TopNEntry,_std::allocator<duckdb::TopNEntry>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  this->payload_types = payload_types_p;
  this->orders = orders_p;
  (this->modifiers).super_vector<duckdb::OrderModifiers,_std::allocator<duckdb::OrderModifiers>_>.
  super__Vector_base<duckdb::OrderModifiers,_std::allocator<duckdb::OrderModifiers>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->modifiers).super_vector<duckdb::OrderModifiers,_std::allocator<duckdb::OrderModifiers>_>.
  super__Vector_base<duckdb::OrderModifiers,_std::allocator<duckdb::OrderModifiers>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->modifiers).super_vector<duckdb::OrderModifiers,_std::allocator<duckdb::OrderModifiers>_>.
  super__Vector_base<duckdb::OrderModifiers,_std::allocator<duckdb::OrderModifiers>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  this->limit = limit;
  this->offset = offset;
  this->heap_size = offset + limit;
  ExpressionExecutor::ExpressionExecutor(&this->executor,context);
  DataChunk::DataChunk(&this->sort_chunk);
  DataChunk::DataChunk(&this->heap_data);
  local_a0 = &this->payload_chunk;
  DataChunk::DataChunk(local_a0);
  local_a8 = &this->sort_keys;
  DataChunk::DataChunk(local_a8);
  StringHeap::StringHeap(&this->sort_key_heap,local_90);
  SelectionVector::SelectionVector(&this->matching_sel,0x800);
  local_b0 = &this->compare_chunk;
  DataChunk::DataChunk(local_b0);
  local_b8 = &this->boundary_values;
  DataChunk::DataChunk(local_b8);
  (this->boundary_val)._M_dataplus._M_p = (pointer)&(this->boundary_val).field_2;
  (this->boundary_val)._M_string_length = 0;
  (this->boundary_val).field_2._M_local_buf[0] = '\0';
  SelectionVector::SelectionVector(&this->final_sel,0x800);
  SelectionVector::SelectionVector(&this->true_sel,0x800);
  SelectionVector::SelectionVector(&this->false_sel,0x800);
  local_c8 = &this->heap_data;
  local_c0 = &this->sort_chunk;
  SelectionVector::SelectionVector(&this->new_remaining_sel,0x800);
  sort_types.super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
  super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  sort_types.super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
  super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  sort_types.super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
  super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  pBVar1 = (this->orders->
           super_vector<duckdb::BoundOrderByNode,_std::allocator<duckdb::BoundOrderByNode>_>).
           super__Vector_base<duckdb::BoundOrderByNode,_std::allocator<duckdb::BoundOrderByNode>_>.
           _M_impl.super__Vector_impl_data._M_finish;
  for (__args = (this->orders->
                super_vector<duckdb::BoundOrderByNode,_std::allocator<duckdb::BoundOrderByNode>_>).
                super__Vector_base<duckdb::BoundOrderByNode,_std::allocator<duckdb::BoundOrderByNode>_>
                ._M_impl.super__Vector_impl_data._M_start; __args != pBVar1; __args = __args + 1) {
    pEVar4 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::
             operator->(&__args->expression);
    ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::push_back
              (&sort_types.super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>,
               &pEVar4->return_type);
    expr = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::operator*
                     (&__args->expression);
    ExpressionExecutor::AddExpression(&this->executor,expr);
    ::std::vector<duckdb::OrderModifiers,std::allocator<duckdb::OrderModifiers>>::
    emplace_back<duckdb::OrderType_const&,duckdb::OrderByNullType_const&>
              ((vector<duckdb::OrderModifiers,std::allocator<duckdb::OrderModifiers>> *)
               &this->modifiers,&__args->type,&__args->null_order);
  }
  uVar2 = this->heap_size * 2;
  uVar5 = 0x2800;
  if (0x2800 < uVar2) {
    uVar5 = uVar2;
  }
  if (0x31fff < uVar5) {
    uVar5 = 0x32000;
  }
  ::std::vector<duckdb::TopNEntry,_std::allocator<duckdb::TopNEntry>_>::reserve
            (&local_98->super_vector<duckdb::TopNEntry,_std::allocator<duckdb::TopNEntry>_>,
             uVar5 + 0x800);
  this_01 = local_c0;
  this_00 = local_c8;
  LogicalType::LogicalType(&local_60,BLOB);
  allocator_00 = local_90;
  __l._M_len = 1;
  __l._M_array = &local_60;
  ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::vector
            (&sort_keys_type.super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>
             ,__l,&local_c9);
  LogicalType::~LogicalType(&local_60);
  DataChunk::Initialize(local_a8,allocator_00,&sort_keys_type,0x800);
  uVar2 = this->heap_size * 2;
  uVar5 = 0x2800;
  if (0x2800 < uVar2) {
    uVar5 = uVar2;
  }
  if (0x31fff < uVar5) {
    uVar5 = 0x32000;
  }
  DataChunk::Initialize(this_00,allocator_00,this->payload_types,uVar5 + 0x800);
  DataChunk::Initialize(local_a0,allocator_00,this->payload_types,0x800);
  DataChunk::Initialize(this_01,allocator_00,&sort_types,0x800);
  DataChunk::Initialize(local_b0,allocator_00,&sort_types,0x800);
  DataChunk::Initialize(local_b8,allocator_00,&sort_types,0x800);
  ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::~vector
            (&sort_keys_type.super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>
            );
  ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::~vector
            (&sort_types.super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>);
  return;
}

Assistant:

TopNHeap::TopNHeap(ClientContext &context, Allocator &allocator, const vector<LogicalType> &payload_types_p,
                   const vector<BoundOrderByNode> &orders_p, idx_t limit, idx_t offset)
    : allocator(allocator), buffer_manager(BufferManager::GetBufferManager(context)), payload_types(payload_types_p),
      orders(orders_p), limit(limit), offset(offset), heap_size(limit + offset), executor(context),
      sort_key_heap(allocator), matching_sel(STANDARD_VECTOR_SIZE), final_sel(STANDARD_VECTOR_SIZE),
      true_sel(STANDARD_VECTOR_SIZE), false_sel(STANDARD_VECTOR_SIZE), new_remaining_sel(STANDARD_VECTOR_SIZE) {
	// initialize the executor and the sort_chunk
	vector<LogicalType> sort_types;
	for (auto &order : orders) {
		auto &expr = order.expression;
		sort_types.push_back(expr->return_type);
		executor.AddExpression(*expr);
		modifiers.emplace_back(order.type, order.null_order);
	}
	heap.reserve(InitialHeapAllocSize());
	vector<LogicalType> sort_keys_type {LogicalType::BLOB};
	sort_keys.Initialize(allocator, sort_keys_type);
	heap_data.Initialize(allocator, payload_types, InitialHeapAllocSize());
	payload_chunk.Initialize(allocator, payload_types);
	sort_chunk.Initialize(allocator, sort_types);
	compare_chunk.Initialize(allocator, sort_types);
	boundary_values.Initialize(allocator, sort_types);
}